

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdAddBlindTxOutData(void *handle,void *blind_handle,uint32_t index,char *confidential_key)

{
  undefined8 uVar1;
  CfdException *this;
  vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_> *in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  TxOutBlindKeys params;
  CfdCapiBlindTxData *buffer;
  TxOutBlindKeys *in_stack_fffffffffffffe20;
  value_type *__x;
  TxOutBlindKeys *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  CfdError error_code;
  allocator *paVar2;
  CfdException *in_stack_fffffffffffffe40;
  allocator local_179;
  string local_178;
  value_type local_158;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [8];
  string *in_stack_ffffffffffffff28;
  void *in_stack_ffffffffffffff30;
  CfdSourceLocation local_c0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  long local_68;
  allocator local_59;
  string local_58 [48];
  vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_> *local_28;
  undefined4 local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"BlindTxData",&local_59);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_68 = local_18;
  if (*(long *)(local_18 + 0x18) == 0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x4e0;
    local_80.funcname = "CfdAddBlindTxOutData";
    cfd::core::logger::warn<>(&local_80,"buffer state is illegal.");
    local_a2 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Failed to parameter. buffer state is illegal.",&local_a1)
    ;
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe40,error_code,(string *)in_stack_fffffffffffffe30);
    local_a2 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_28 == (vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_> *)0x0
     ) {
    local_c0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_c0.filename = local_c0.filename + 1;
    local_c0.line = 0x4e6;
    local_c0.funcname = "CfdAddBlindTxOutData";
    cfd::core::logger::warn<>(&local_c0,"confidential key is null.");
    local_e2 = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e0,"Failed to parameter. confidential key is null.",&local_e1);
    cfd::core::CfdException::CfdException(this,error_code,(string *)in_stack_fffffffffffffe30);
    local_e2 = 0;
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::api::TxOutBlindKeys::TxOutBlindKeys(in_stack_fffffffffffffe30);
  local_158.confidential_key.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = local_1c;
  paVar2 = &local_179;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,(char *)local_28,paVar2);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_158,&local_178);
  __x = &local_158;
  cfd::core::Pubkey::operator=(&local_158.blinding_key,(Pubkey *)__x);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x5af79a);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>::push_back
            (local_28,__x);
  local_4 = 0;
  cfd::api::TxOutBlindKeys::~TxOutBlindKeys(in_stack_fffffffffffffe20);
  return local_4;
}

Assistant:

int CfdAddBlindTxOutData(
    void* handle, void* blind_handle, uint32_t index,
    const char* confidential_key) {
  try {
    cfd::Initialize();
    CheckBuffer(blind_handle, kPrefixBlindTxData);

    CfdCapiBlindTxData* buffer =
        static_cast<CfdCapiBlindTxData*>(blind_handle);
    if (buffer->txout_blind_keys == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer state is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. buffer state is illegal.");
    }
    if (confidential_key == nullptr) {
      warn(CFD_LOG_SOURCE, "confidential key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential key is null.");
    }

    TxOutBlindKeys params;
    params.index = index;
    params.confidential_key = Pubkey(confidential_key);

    buffer->txout_blind_keys->push_back(params);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}